

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

double __thiscall ON_Font::AppleFontWeightTraitEx(ON_Font *this)

{
  double dVar1;
  
  dVar1 = -1.23432101234321e+308;
  if ((this->m_font_origin == AppleFont) && (ABS(this->m_apple_font_weight_trait) <= 1.0)) {
    dVar1 = this->m_apple_font_weight_trait;
  }
  return dVar1;
}

Assistant:

double ON_Font::AppleFontWeightTraitEx() const
{
  return
    ON_Font::Origin::AppleFont == FontOrigin()
    && m_apple_font_weight_trait >= -1.0
    && m_apple_font_weight_trait <= 1.0
    ? m_apple_font_weight_trait
    : ON_UNSET_VALUE;
}